

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_test.cpp
# Opt level: O2

void __thiscall QuadDrawer::render(QuadDrawer *this)

{
  Matrix3x3 *pMVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  Matrix3x3 local_138;
  Matrix3x3 local_f0;
  Matrix3x3 local_a8;
  Matrix3x3 local_60;
  
  glBindTexture(0xde1,texture);
  glBegin(7);
  glColor3f(0x3f800000,0x3f800000,0);
  pMVar1 = &this->mat;
  CGL::Matrix3x3::Matrix3x3(&local_60,pMVar1);
  dVar2 = (this->a).x;
  dVar3 = (this->a).y;
  dVar4 = (this->a).z;
  CGL::Matrix3x3::Matrix3x3(&local_a8,pMVar1);
  dVar5 = (this->b).x;
  dVar6 = (this->b).y;
  dVar7 = (this->b).z;
  CGL::Matrix3x3::Matrix3x3(&local_f0,pMVar1);
  dVar8 = (this->c).x;
  dVar9 = (this->c).y;
  dVar10 = (this->c).z;
  CGL::Matrix3x3::Matrix3x3(&local_138,pMVar1);
  dVar11 = (this->d).x;
  dVar12 = (this->d).y;
  dVar13 = (this->d).z;
  glTexCoord2f(0,0);
  glVertex3f((float)dVar2,(float)dVar3,(float)dVar4);
  glTexCoord2f(0,0x3f800000);
  glVertex3f((float)dVar5,(float)dVar6,(float)dVar7);
  glTexCoord2f(0x3f800000,0x3f800000);
  glVertex3f((float)dVar8,(float)dVar9,(float)dVar10);
  glTexCoord2f(0x3f800000,0);
  glVertex3f((float)dVar11,(float)dVar12,(float)dVar13);
  glDeleteTextures(1,&texture);
  glDisable(0xde1);
  glEnd();
  return;
}

Assistant:

void render() {
    glBindTexture(GL_TEXTURE_2D, texture); // Comment this out to disable textures
    glBegin(GL_QUADS);

    glColor3f( 1.0, 1.0, 0.0); // Can play with RGB values here :)

    Vector3D a_trans = mult(mat, a);
    Vector3D b_trans = mult(mat, b);
    Vector3D c_trans = mult(mat, c);
    Vector3D d_trans = mult(mat, d);
      
    glTexCoord2f(0,0);
    glVertex3f(a_trans[0], a_trans[1], a_trans[2]);
    /* TODO: change the (0,1) below to (0,.1) to zoom into the texture to see changes. */
    glTexCoord2f(0,1);
    glVertex3f(b_trans[0], b_trans[1], b_trans[2]);
    /* TODO: change the (1,1) below to (.1,.1) to zoom into the texture to see changes. */
    glTexCoord2f(1,1);
    glVertex3f(c_trans[0], c_trans[1], c_trans[2]);
    /* TODO: change the (1,0) to (.1,0) to zoom into the texture to see changes. */
    glTexCoord2f(1,0);
    glVertex3f(d_trans[0], d_trans[1], d_trans[2]);
    glDeleteTextures(1, &texture);
    glDisable(GL_TEXTURE_2D);
    glEnd();
  }